

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ngram.c
# Opt level: O3

void ReadUTF8_test(FILE *fp)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  ulong local_438;
  size_t gram_nums [64];
  char *words [64];
  
  fgets(iobuf,200000,(FILE *)fp);
  uVar1 = atoi(iobuf);
  uVar2 = Ngram_order(ngram);
  if (uVar2 != uVar1) {
    __assert_fail("Ngram_order(ngram) == order",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                  ,0x1c,"void ReadUTF8_test(FILE *)");
  }
  uVar9 = 0;
  do {
    if (uVar1 == uVar9) {
      uVar2 = Ngram_word_num(ngram);
      if (local_438 != uVar2) {
        __assert_fail("Ngram_word_num(ngram) == gram_nums[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                      ,0x23,"void ReadUTF8_test(FILE *)");
      }
      while( true ) {
        pcVar7 = fgets(iobuf,200000,(FILE *)fp);
        if (pcVar7 == (char *)0x0) {
          return;
        }
        sVar8 = strlen(iobuf);
        if ((&DAT_001080ef)[sVar8] == '\n') {
          (&DAT_001080ef)[sVar8] = 0;
        }
        pcVar7 = strtok(iobuf,"\t");
        uVar1 = atoi(pcVar7);
        if (0 < (int)uVar1) {
          uVar9 = 0;
          do {
            pcVar7 = strtok((char *)0x0,"\t");
            gram_nums[uVar9 + 0x3f] = (size_t)pcVar7;
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        pcVar7 = strtok((char *)0x0,"\t");
        uVar2 = atoi(pcVar7);
        pcVar7 = strtok((char *)0x0,"\t");
        uVar3 = atoi(pcVar7);
        uVar4 = Ngram_prob2(ngram,(char **)(gram_nums + 0x3f),uVar1);
        if (uVar4 != uVar2) break;
        uVar2 = Ngram_bow2(ngram,(char **)(gram_nums + 0x3f),uVar1);
        if (uVar2 != uVar3) {
          __assert_fail("Ngram_bow2(ngram, (const char**)words,order) == bow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                        ,0x33,"void ReadUTF8_test(FILE *)");
        }
      }
      __assert_fail("Ngram_prob2(ngram,(const char**)words,order) == prob",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                    ,0x32,"void ReadUTF8_test(FILE *)");
    }
    fgets(iobuf,200000,(FILE *)fp);
    sVar5 = atol(iobuf);
    gram_nums[uVar9 - 1] = sVar5;
    uVar9 = uVar9 + 1;
    sVar6 = Ngram_gram_num(ngram,(uint32_t)uVar9);
  } while (sVar6 == sVar5);
  __assert_fail("Ngram_gram_num(ngram, i+1) == gram_nums[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                ,0x21,"void ReadUTF8_test(FILE *)");
}

Assistant:

void ReadUTF8_test(FILE* fp)
{
    fgets((char*)iobuf, sizeof(iobuf), fp);
    int order = atoi(iobuf);
    assert(Ngram_order(ngram) == order);
    size_t gram_nums[MAX_ORDER];
    for (uint32_t i = 0;i<order;i++) {
         fgets((char*)iobuf, sizeof(iobuf), fp);
         gram_nums[i] = atol(iobuf);
         assert(Ngram_gram_num(ngram, i+1) == gram_nums[i]);
    }
    assert(Ngram_word_num(ngram) == gram_nums[0]);
    char* words[MAX_ORDER];
    while( fgets((char*)iobuf, sizeof(iobuf), fp))
    {
        size_t len = strlen(iobuf);
        if (iobuf[len-1] == '\n') {
            iobuf[len-1] = 0;
        }
        //order\tword\t...\tprob\tbow
        int order = atoi(strtok(iobuf, "\t"));
        for (int i = 0;i<order;i++) {
            words[i] = strtok(NULL,"\t");
        }
        uint32_t prob = atoi(strtok(NULL, "\t"));
        uint32_t bow = atoi(strtok(NULL, "\t"));
        assert(Ngram_prob2(ngram,(const char**)words,order) == prob);
        assert(Ngram_bow2(ngram, (const char**)words,order) == bow);
    }
}